

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

Literal * Kernel::LiteralNormalizer::normalize(Literal *in)

{
  bool bVar1;
  uint uVar2;
  Interpretation IVar3;
  Term *in_RDI;
  Interpretation i;
  uint functor;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 local_8;
  
  uVar2 = Term::functor(in_RDI);
  bVar1 = Theory::isInterpretedPredicate
                    ((Theory *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  local_8 = in_RDI;
  if (bVar1) {
    IVar3 = Theory::interpretPredicate
                      ((Theory *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
    if (IVar3 == INT_LESS) {
      local_8 = &InequalityNormalizer<Kernel::IntLess>::normalize((Literal *)CONCAT44(uVar2,6))->
                 super_Term;
    }
    else if (IVar3 == RAT_LESS) {
      local_8 = &InequalityNormalizer<Kernel::FracLess<Kernel::RationalConstantType>_>::normalize
                           ((Literal *)CONCAT44(uVar2,0xe))->super_Term;
    }
    else if (IVar3 == REAL_LESS) {
      local_8 = &InequalityNormalizer<Kernel::FracLess<Kernel::RealConstantType>_>::normalize
                           ((Literal *)CONCAT44(uVar2,0x15))->super_Term;
    }
  }
  return (Literal *)local_8;
}

Assistant:

static Literal* normalize(Literal* in) {
    auto functor = in->functor();

    if (theory->isInterpretedPredicate(functor)) {
      auto i = theory->interpretPredicate(functor);

      switch (i) {
        case Interpretation::INT_LESS: 
          return InequalityNormalizer<IntLess>::normalize(in);

        case Interpretation::RAT_LESS: 
          return InequalityNormalizer<FracLess<RationalConstantType>>::normalize(in);

        case Interpretation::REAL_LESS: 
          return InequalityNormalizer<FracLess<RealConstantType>>::normalize(in);

        default: 
          return in;
      }
    } else {
      /* uninterpreted predicate */
      return in;
    }
  }